

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_handle_unk(Parser *this)

{
  char *pcVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  undefined1 uVar8;
  int iVar9;
  NodeData *pNVar10;
  size_t sVar11;
  State *pSVar12;
  size_t sVar13;
  size_t sVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr chars;
  ro_substr pattern_02;
  ro_substr chars_00;
  ro_substr chars_01;
  ro_substr pattern_03;
  ro_substr chars_02;
  ro_substr chars_03;
  ro_substr pattern_04;
  ro_substr pattern_05;
  ro_substr pattern_06;
  ro_substr pattern_07;
  ro_substr pattern_08;
  csubstr fmt;
  csubstr fmt_00;
  ro_substr pattern_09;
  ro_substr pattern_10;
  ro_substr pattern_11;
  ro_substr pattern_12;
  ro_substr chars_04;
  ro_substr pattern_13;
  ro_substr chars_05;
  ro_substr pattern_14;
  csubstr rem;
  csubstr fmt_01;
  csubstr cVar19;
  size_t sStackY_150;
  basic_substring<const_char> local_118;
  bool is_quoted;
  basic_substring<const_char> trimmed;
  char msg [39];
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  pSVar12 = this->m_state;
  local_118.str = (pSVar12->line_contents).rem.str;
  local_118.len = (pSVar12->line_contents).rem.len;
  pNVar10 = node(this,pSVar12);
  pSVar12 = this->m_state;
  uVar15 = pSVar12->flags;
  if ((uVar15 >> 0xc & 1) != 0) {
    iVar9 = basic_substring<const_char>::compare(&local_118,"---",3);
    if ((iVar9 == 0) ||
       (pattern_08.len = 4, pattern_08.str = "--- ",
       bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_08), bVar7)) {
      cVar19.len = local_118.len;
      cVar19.str = local_118.str;
      _start_new_doc(this,cVar19);
      return true;
    }
    trimmed = basic_substring<const_char>::triml(&local_118,' ');
    uVar17 = trimmed.len;
    iVar9 = basic_substring<const_char>::compare(&trimmed,"---",3);
    if (iVar9 == 0) {
LAB_001c49a2:
      if (local_118.len < uVar17) {
        builtin_strncpy(msg,"check failed: (rem.len >= trimmed.len)",0x27);
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          uVar8 = (*pcVar3)();
          return (bool)uVar8;
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar19 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_38 = cVar19.len;
        pcStack_40 = cVar19.str;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6c35) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x6c35) << 0x40,8);
        LVar5.name.str = pcStack_40;
        LVar5.name.len = local_38;
        (*p_Var2)(msg,0x27,LVar5,(this->m_stack).m_callbacks.m_user_data);
        uVar17 = trimmed.len;
      }
      _line_progressed(this,local_118.len - uVar17);
      _start_new_doc(this,trimmed);
      _save_indentation(this,0);
      return true;
    }
    pattern_10.len = 4;
    pattern_10.str = "--- ";
    bVar7 = basic_substring<const_char>::begins_with(&trimmed,pattern_10);
    if (bVar7) {
      uVar17 = trimmed.len;
      goto LAB_001c49a2;
    }
    pattern_13.len = 3;
    pattern_13.str = "...";
    bVar7 = basic_substring<const_char>::begins_with(&trimmed,pattern_13);
    if (bVar7) {
      _end_stream(this);
    }
    else {
      chars_05.len = 2;
      chars_05.str = "#%";
      sVar11 = basic_substring<const_char>::first_of(&trimmed,chars_05,0);
      if (sVar11 == 0xffffffffffffffff) {
        sVar11 = this->m_state->indref;
        _push_level(this,false);
        _start_doc(this,true);
        this->m_state->indref = sVar11;
      }
    }
    if ((trimmed.len == 0) || (trimmed.str == (char *)0x0)) {
      builtin_strncpy(msg + 0x10,"trimmed.empty())",0x11);
      builtin_strncpy(msg,"check failed: (!",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        uVar8 = (*pcVar3)();
        return (bool)uVar8;
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar19 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_60 = cVar19.len;
      pcStack_68 = cVar19.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6c47) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x6c47) << 0x40,8);
      LVar6.name.str = pcStack_68;
      LVar6.name.len = local_60;
      (*p_Var2)(msg,0x21,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    pSVar12 = this->m_state;
    uVar15 = pSVar12->flags;
  }
  if ((uVar15 & 0x10c) != 0) {
    builtin_strncpy(msg + 0x10,"as_none(RNXT|RSEQ|RMAP)",0x17);
    builtin_strncpy(msg,"check failed: (h",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      uVar8 = (*pcVar3)();
      return (bool)uVar8;
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar19 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_88 = cVar19.len;
    pcStack_90 = cVar19.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6c4a) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x6c4a) << 0x40,8);
    LVar4.name.str = pcStack_90;
    LVar4.name.len = local_88;
    (*p_Var2)(msg,0x29,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar12 = this->m_state;
  }
  if (pSVar12->indref != 0) {
    sVar11 = basic_substring<const_char>::first_not_of(&local_118,' ',0);
    if ((sVar11 != 0xffffffffffffffff) && (local_118.len < sVar11)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar3 = (code *)swi(3);
        uVar8 = (*pcVar3)();
        return (bool)uVar8;
      }
      handle_error(0x1e71c6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1569,"pos <= len || pos == npos");
    }
    if (sVar11 == 0xffffffffffffffff) {
      msg._0_8_ = local_118.str;
      msg[8] = (undefined1)local_118.len;
      msg[9] = local_118.len._1_1_;
      msg[10] = local_118.len._2_1_;
      msg[0xb] = local_118.len._3_1_;
      msg[0xc] = local_118.len._4_1_;
      msg[0xd] = local_118.len._5_1_;
      msg[0xe] = local_118.len._6_1_;
      msg[0xf] = local_118.len._7_1_;
    }
    else {
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)msg,local_118.str,sVar11);
    }
    sVar11 = this->m_state->indref;
    if (sVar11 <= (ulong)msg._8_8_) {
      _line_progressed(this,sVar11);
      uVar17 = this->m_state->indref;
      if (local_118.len < uVar17) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar3 = (code *)swi(3);
          uVar8 = (*pcVar3)();
          return (bool)uVar8;
        }
        handle_error(0x1e71c6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)msg,local_118.str + uVar17,local_118.len - uVar17);
      local_118.str = (char *)msg._0_8_;
      local_118.len._0_1_ = msg[8];
      local_118.len._1_1_ = msg[9];
      local_118.len._2_1_ = msg[10];
      local_118.len._3_1_ = msg[0xb];
      local_118.len._4_1_ = msg[0xc];
      local_118.len._5_1_ = msg[0xd];
      local_118.len._6_1_ = msg[0xe];
      local_118.len._7_1_ = msg[0xf];
    }
  }
  pattern.len = 2;
  pattern.str = "- ";
  bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern);
  if (bVar7) {
    _move_key_anchor_to_val_anchor(this);
    _move_key_tag_to_val_tag(this);
    _push_level(this,false);
    _start_seq(this,pNVar10 == (NodeData *)0x0);
LAB_001c40a3:
    _save_indentation(this,0);
    sStackY_150 = 2;
  }
  else {
    iVar9 = basic_substring<const_char>::compare(&local_118,'-');
    if (iVar9 == 0) {
      _move_key_anchor_to_val_anchor(this);
      _move_key_tag_to_val_tag(this);
      _push_level(this,false);
      _start_seq(this,pNVar10 == (NodeData *)0x0);
LAB_001c4151:
      _save_indentation(this,0);
    }
    else {
      if (local_118.len == 0) {
LAB_001c4160:
        pattern_00.len = 2;
        pattern_00.str = "? ";
        bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_00);
        if (bVar7) {
          _move_key_anchor_to_val_anchor(this);
          _move_key_tag_to_val_tag(this);
          _push_level(this,false);
          _start_map(this,pNVar10 == (NodeData *)0x0);
          pSVar12 = this->m_state;
          uVar15 = pSVar12->flags & 0xffffff1fU | 0x60;
        }
        else {
          pattern_01.len = 2;
          pattern_01.str = ": ";
          bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_01);
          if ((!bVar7) || ((this->m_state->flags & 0x200) != 0)) {
            iVar9 = basic_substring<const_char>::compare(&local_118,':');
            if ((iVar9 == 0) && ((this->m_state->flags & 0x200) == 0)) {
              _move_key_anchor_to_val_anchor(this);
              _move_key_tag_to_val_tag(this);
              _push_level(this,false);
              _start_map(this,pNVar10 == (NodeData *)0x0);
              _store_scalar_null(this,local_118.str);
              this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
              goto LAB_001c4151;
            }
            bVar7 = _handle_types(this);
            if (bVar7) {
              return true;
            }
            if (((local_118.len == 0) || (*local_118.str != '*')) &&
               (bVar7 = _handle_key_anchors_and_refs(this), bVar7)) {
              return true;
            }
            if ((this->m_state->flags & 0x200) != 0) {
              trimmed = (basic_substring<const_char>)ZEXT816(0);
              bVar7 = _scan_scalar_unk(this,&trimmed,&is_quoted);
              if (bVar7) {
                local_118.str = (this->m_state->line_contents).rem.str;
                local_118.len = (this->m_state->line_contents).rem.len;
                chars_00.len = 2;
                chars_00.str = " \t";
                bVar7 = basic_substring<const_char>::begins_with_any(&local_118,chars_00);
                if (bVar7) {
                  chars_01.len = 2;
                  chars_01.str = " \t";
                  sVar11 = basic_substring<const_char>::first_not_of(&local_118,chars_01,0);
                  if (local_118.len < sVar11) {
                    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7))
                    {
                      pcVar3 = (code *)swi(3);
                      uVar8 = (*pcVar3)();
                      return (bool)uVar8;
                    }
                    handle_error(0x1e71c6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                 ,0x1533,"first >= 0 && first <= len");
                  }
                  basic_substring<const_char>::basic_substring
                            ((basic_substring<const_char> *)msg,local_118.str + sVar11,
                             local_118.len - sVar11);
                  local_118.str = (char *)msg._0_8_;
                  local_118.len._0_1_ = msg[8];
                  local_118.len._1_1_ = msg[9];
                  local_118.len._2_1_ = msg[10];
                  local_118.len._3_1_ = msg[0xb];
                  local_118.len._4_1_ = msg[0xc];
                  local_118.len._5_1_ = msg[0xd];
                  local_118.len._6_1_ = msg[0xe];
                  local_118.len._7_1_ = msg[0xf];
                  _line_progressed(this,sVar11);
                }
              }
              pattern_03.len = 2;
              pattern_03.str = ", ";
              bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_03);
              if (bVar7) {
                _start_seq(this,pNVar10 == (NodeData *)0x0);
                this->m_state->flags = this->m_state->flags | 0x10;
                cVar19 = _consume_scalar(this);
                _append_val(this,cVar19,0);
LAB_001c4636:
                sStackY_150 = 2;
              }
              else {
                if ((local_118.len == 0) || (*local_118.str != ',')) {
                  pattern_04.len = 2;
                  pattern_04.str = ": ";
                  bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_04);
                  if (bVar7) {
                    _start_map_unk(this,pNVar10 == (NodeData *)0x0);
                    goto LAB_001c4636;
                  }
                  iVar9 = basic_substring<const_char>::compare(&local_118,":",1);
                  if (((iVar9 == 0) ||
                      (pattern_05.len = 2, pattern_05.str = ":\"",
                      bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_05), bVar7
                      )) || (pattern_06.len = 2, pattern_06.str = ":\'",
                            bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_06),
                            bVar7)) {
                    _start_map_unk(this,pNVar10 == (NodeData *)0x0);
                  }
                  else {
                    if ((local_118.len == 0) || (*local_118.str != '}')) {
                      pattern_09.len = 3;
                      pattern_09.str = "...";
                      bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_09);
                      if (!bVar7) {
                        if ((local_118.len != 0) && (*local_118.str == '#')) {
                          _scan_comment(this);
                          return true;
                        }
                        bVar7 = _handle_key_anchors_and_refs(this);
                        if (bVar7) {
                          return true;
                        }
                        pattern_11.len = 1;
                        pattern_11.str = " ";
                        bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_11);
                        if ((!bVar7) &&
                           (pattern_12.len = 1, pattern_12.str = "\t",
                           bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_12),
                           sVar11 = local_118.len, pcVar16 = local_118.str, !bVar7)) {
                          if (local_118.str != (char *)0x0 && local_118.len != 0) {
                            iVar9 = basic_substring<const_char>::compare(&local_118,"---",3);
                            if ((iVar9 == 0) ||
                               (pattern_14.len = 4, pattern_14.str = "--- ",
                               bVar7 = basic_substring<const_char>::begins_with
                                                 (&local_118,pattern_14), pcVar16 = local_118.str,
                               sVar11 = local_118.len, bVar7)) {
                              rem.len = sVar11;
                              rem.str = pcVar16;
                              _start_new_doc(this,rem);
                              return true;
                            }
                            if ((local_118.len != 0) && (*local_118.str == '%')) goto LAB_001c47f3;
                            bVar7 = is_debugger_attached();
                            if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
                              pcVar3 = (code *)swi(3);
                              uVar8 = (*pcVar3)();
                              return (bool)uVar8;
                            }
                            fmt_01.len = 0x12;
                            fmt_01.str = "ERROR: parse error";
                            _err<>(this,fmt_01);
                          }
                          goto LAB_001c46a9;
                        }
                        chars_04.len = 2;
                        chars_04.str = " \t";
                        sVar11 = basic_substring<const_char>::first_not_of(&local_118,chars_04,0);
                        if (sVar11 == 0xffffffffffffffff) {
                          sVar11 = local_118.len;
                        }
                        goto LAB_001c47f3;
                      }
                      _end_stream(this);
                      sStackY_150 = 3;
                      goto LAB_001c46a0;
                    }
                    uVar15 = this->m_state->flags;
                    if ((~uVar15 & 0x14) != 0) {
                      bVar7 = is_debugger_attached();
                      if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
                        pcVar3 = (code *)swi(3);
                        uVar8 = (*pcVar3)();
                        return (bool)uVar8;
                      }
                      fmt.len = 0x27;
                      fmt.str = "ERROR: invalid token: not reading a map";
                      _err<>(this,fmt);
                      uVar15 = this->m_state->flags;
                    }
                    if ((uVar15 >> 9 & 1) == 0) {
                      bVar7 = is_debugger_attached();
                      if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
                        pcVar3 = (code *)swi(3);
                        uVar8 = (*pcVar3)();
                        return (bool)uVar8;
                      }
                      fmt_00.len = 0x17;
                      fmt_00.str = "ERROR: no scalar stored";
                      _err<>(this,fmt_00);
                    }
                    _append_key_val(this,trimmed,0);
                    _stop_map(this);
                  }
                }
                else {
                  _start_seq(this,pNVar10 == (NodeData *)0x0);
                  this->m_state->flags = this->m_state->flags | 0x10;
                  cVar19 = _consume_scalar(this);
                  _append_val(this,cVar19,0);
                }
                sStackY_150 = 1;
              }
LAB_001c46a0:
              _line_progressed(this,sStackY_150);
LAB_001c46a9:
              if (trimmed.str != (char *)0x0 && trimmed.len != 0) {
                _store_scalar(this,trimmed,(uint)is_quoted);
                return true;
              }
              return true;
            }
            trimmed = (basic_substring<const_char>)ZEXT816(0);
            sVar11 = (this->m_state->line_contents).indentation;
            bVar7 = _scan_scalar_unk(this,&trimmed,&is_quoted);
            if (bVar7) {
              local_118.str = (this->m_state->line_contents).rem.str;
              local_118.len = (this->m_state->line_contents).rem.len;
              sVar14 = 2;
              chars.len = 2;
              chars.str = " \t";
              sVar13 = basic_substring<const_char>::first_not_of(&local_118,chars,0);
              if (sVar13 - 1 < 0xfffffffffffffffe) {
                _line_progressed(this,sVar13);
                if (local_118.len < sVar13) {
                  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
                    pcVar3 = (code *)swi(3);
                    uVar8 = (*pcVar3)();
                    return (bool)uVar8;
                  }
                  handle_error(0x1e71c6,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x1533,"first >= 0 && first <= len");
                }
                basic_substring<const_char>::basic_substring
                          ((basic_substring<const_char> *)msg,local_118.str + sVar13,
                           local_118.len - sVar13);
                local_118.str = (char *)msg._0_8_;
                local_118.len._0_1_ = msg[8];
                local_118.len._1_1_ = msg[9];
                local_118.len._2_1_ = msg[10];
                local_118.len._3_1_ = msg[0xb];
                local_118.len._4_1_ = msg[0xc];
                local_118.len._5_1_ = msg[0xd];
                local_118.len._6_1_ = msg[0xe];
                local_118.len._7_1_ = msg[0xf];
              }
              _store_scalar(this,trimmed,(uint)is_quoted);
              pattern_02.len = 2;
              pattern_02.str = ": ";
              bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_02);
              if (!bVar7) {
                sVar14 = 1;
                iVar9 = basic_substring<const_char>::compare(&local_118,":",1);
                if (iVar9 != 0) {
                  return true;
                }
              }
              _push_level(this,false);
              _start_map(this,pNVar10 == (NodeData *)0x0);
            }
            else {
              chars_02.len = 2;
              chars_02.str = " \t";
              bVar7 = basic_substring<const_char>::begins_with_any(&local_118,chars_02);
              if (!bVar7) {
                return false;
              }
              chars_03.len = 2;
              chars_03.str = " \t";
              sVar11 = basic_substring<const_char>::first_not_of(&local_118,chars_03,0);
              if (sVar11 != 0xffffffffffffffff && local_118.len < sVar11) {
                if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
                  pcVar3 = (code *)swi(3);
                  uVar8 = (*pcVar3)();
                  return (bool)uVar8;
                }
                handle_error(0x1e71c6,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1569,"pos <= len || pos == npos");
              }
              if (sVar11 == 0xffffffffffffffff) {
                msg._0_8_ = local_118.str;
                msg[8] = (undefined1)local_118.len;
                msg[9] = local_118.len._1_1_;
                msg[10] = local_118.len._2_1_;
                msg[0xb] = local_118.len._3_1_;
                msg[0xc] = local_118.len._4_1_;
                msg[0xd] = local_118.len._5_1_;
                msg[0xe] = local_118.len._6_1_;
                msg[0xf] = local_118.len._7_1_;
              }
              else {
                basic_substring<const_char>::basic_substring
                          ((basic_substring<const_char> *)msg,local_118.str,sVar11);
              }
              sVar11 = msg._8_8_;
              sVar14 = local_118.len;
              if (local_118.len == 0) {
                if (msg._8_8_ != 0) goto LAB_001c4712;
                sVar14 = 0;
              }
              else if ((ulong)msg._0_8_ < local_118.str ||
                       local_118.str + local_118.len < (char *)(msg._8_8_ + msg._0_8_)) {
LAB_001c4712:
                if (msg._0_8_ != 0 && msg._8_8_ != 0) {
                  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
                    pcVar3 = (code *)swi(3);
                    uVar8 = (*pcVar3)();
                    return (bool)uVar8;
                  }
                  handle_error(0x1e71c6,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x159e,"is_super(subs) || subs.empty()");
                }
              }
              pcVar16 = (char *)(msg._0_8_ + msg._8_8_);
              uVar17 = (long)pcVar16 - (long)local_118.str;
              sVar13 = 0;
              if ((local_118.str <= pcVar16) && (pcVar1 = local_118.str + sVar14, pcVar16 <= pcVar1)
                 ) {
                if (sVar14 < uVar17) {
                  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
                    pcVar3 = (code *)swi(3);
                    uVar8 = (*pcVar3)();
                    return (bool)uVar8;
                  }
                  handle_error(0x1e71c6,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x153a,"first >= 0 && first <= len");
                }
                uVar18 = (long)pcVar1 - (long)pcVar16;
                if ((uVar18 != 0xffffffffffffffff) && (sVar14 < uVar18)) {
                  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
                    pcVar3 = (code *)swi(3);
                    uVar8 = (*pcVar3)();
                    return (bool)uVar8;
                  }
                  handle_error(0x1e71c6,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
                }
                sVar13 = sVar14 - uVar17;
                if (uVar18 != 0xffffffffffffffff) {
                  sVar13 = uVar18;
                }
                if ((pcVar1 != pcVar16) && (sVar14 < sVar13 + uVar17)) {
                  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
                    pcVar3 = (code *)swi(3);
                    uVar8 = (*pcVar3)();
                    return (bool)uVar8;
                  }
                  handle_error(0x1e71c6,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
                }
                basic_substring<const_char>::basic_substring
                          ((basic_substring<const_char> *)msg,local_118.str + uVar17,sVar13);
                local_118.str = (char *)msg._0_8_;
                sVar13 = msg._8_8_;
              }
              local_118.len = sVar13;
              if (((this->m_state->flags & 1) == 0) ||
                 (pattern_07.len = 3, pattern_07.str = "---",
                 bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_07),
                 sVar14 = sVar11, !bVar7)) goto LAB_001c47f3;
            }
            this->m_state->indref = sVar11;
            sVar11 = sVar14;
LAB_001c47f3:
            _line_progressed(this,sVar11);
            return true;
          }
          _move_key_anchor_to_val_anchor(this);
          _move_key_tag_to_val_tag(this);
          _push_level(this,false);
          _start_map(this,pNVar10 == (NodeData *)0x0);
          _store_scalar_null(this,local_118.str);
          pSVar12 = this->m_state;
          uVar15 = pSVar12->flags & 0xffffff3fU | 0x80;
        }
        pSVar12->flags = uVar15;
        goto LAB_001c40a3;
      }
      if (*local_118.str == '{') {
        _move_key_anchor_to_val_anchor(this);
        _move_key_tag_to_val_tag(this);
        _push_level(this,true);
        _start_map(this,pNVar10 == (NodeData *)0x0);
        this->m_state->flags = this->m_state->flags & 0xffffff2fU | 0x50;
      }
      else {
        if (*local_118.str != '[') goto LAB_001c4160;
        _move_key_anchor_to_val_anchor(this);
        _move_key_tag_to_val_tag(this);
        _push_level(this,true);
        _start_seq(this,pNVar10 == (NodeData *)0x0);
        this->m_state->flags = this->m_state->flags | 0x10;
      }
    }
    sStackY_150 = 1;
  }
  _line_progressed(this,sStackY_150);
  return true;
}

Assistant:

bool Parser::_handle_unk()
{
    _c4dbgp("handle_unk");

    csubstr rem = m_state->line_contents.rem;
    const bool start_as_child = (node(m_state) == nullptr);

    if(C4_UNLIKELY(has_any(NDOC)))
    {
        if(rem == "---" || rem.begins_with("--- "))
        {
            _start_new_doc(rem);
            return true;
        }
        auto trimmed = rem.triml(' ');
        if(trimmed == "---" || trimmed.begins_with("--- "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len >= trimmed.len);
            _line_progressed(rem.len - trimmed.len);
            _start_new_doc(trimmed);
            _save_indentation();
            return true;
        }
        else if(trimmed.begins_with("..."))
        {
            _end_stream();
        }
        else if(trimmed.first_of("#%") == csubstr::npos) // neither a doc nor a tag
        {
            _c4dbgpf("starting implicit doc to accomodate unexpected tokens: '{}'", rem);
            size_t indref = m_state->indref;
            _push_level();
            _start_doc();
            _set_indentation(indref);
        }
        _RYML_CB_ASSERT(m_stack.m_callbacks, !trimmed.empty());
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT|RSEQ|RMAP));
    if(m_state->indref > 0)
    {
        csubstr ws = rem.left_of(rem.first_not_of(' '));
        if(m_state->indref <= ws.len)
        {
            _c4dbgpf("skipping base indentation of {}", m_state->indref);
            _line_progressed(m_state->indref);
            rem = rem.sub(m_state->indref);
        }
    }

    if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == '-')
    {
        _c4dbgpf("it's a seq (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_seq(start_as_child);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('['))
    {
        _c4dbgpf("it's a seq, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_seq(start_as_child);
        add_flags(FLOW);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with('{'))
    {
        _c4dbgpf("it's a map, flow (as_child={})", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level(/*explicit flow*/true);
        _start_map(start_as_child);
        addrem_flags(FLOW|RKEY, RVAL);
        _line_progressed(1);
        return true;
    }
    else if(rem.begins_with("? "))
    {
        _c4dbgpf("it's a map (as_child={}) + this key is complex", start_as_child);
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        addrem_flags(RKEY|QMRK, RVAL);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem.begins_with(": ") && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(2);
        return true;
    }
    else if(rem == ':' && !has_all(SSCL))
    {
        _c4dbgp("it's a map with an empty key");
        _move_key_anchor_to_val_anchor();
        _move_key_tag_to_val_tag();
        _push_level();
        _start_map(start_as_child);
        _store_scalar_null(rem.str);
        addrem_flags(RVAL, RKEY);
        _save_indentation();
        _line_progressed(1);
        return true;
    }
    else if(_handle_types())
    {
        return true;
    }
    else if(!rem.begins_with('*') && _handle_key_anchors_and_refs())
    {
        return true;
    }
    else if(has_all(SSCL))
    {
        _c4dbgpf("there's a stored scalar: '{}'", m_state->scalar);

        csubstr saved_scalar;
        bool is_quoted;
        if(_scan_scalar_unk(&saved_scalar, &is_quoted))
        {
            rem = m_state->line_contents.rem;
            _c4dbgpf("... and there's also a scalar next! '{}'", saved_scalar);
            if(rem.begins_with_any(" \t"))
            {
                size_t n = rem.first_not_of(" \t");
                _c4dbgpf("skipping {} spaces/tabs", n);
                rem = rem.sub(n);
                _line_progressed(n);
            }
        }

        _c4dbgpf("rem='{}'", rem);

        if(rem.begins_with(", "))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(2);
        }
        else if(rem.begins_with(','))
        {
            _c4dbgpf("got a ',' -- it's a seq (as_child={})", start_as_child);
            _start_seq(start_as_child);
            add_flags(FLOW);
            _append_val(_consume_scalar());
            _line_progressed(1);
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("got a ': ' -- it's a map (as_child={})", start_as_child);
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(2);
        }
        else if(rem == ":" || rem.begins_with(":\"") || rem.begins_with(":'"))
        {
            if(rem == ":") { _c4dbgpf("got a ':' -- it's a map (as_child={})", start_as_child); }
            else { _c4dbgpf("got a '{}' -- it's a map (as_child={})", rem.first(2), start_as_child); }
            _start_map_unk(start_as_child); // wait for the val scalar to append the key-val pair
            _line_progressed(1); // advance only 1
        }
        else if(rem.begins_with('}'))
        {
            if(!has_all(RMAP|FLOW))
            {
                _c4err("invalid token: not reading a map");
            }
            if(!has_all(SSCL))
            {
                _c4err("no scalar stored");
            }
            _append_key_val(saved_scalar);
            _stop_map();
            _line_progressed(1);
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("got stream end '...'");
            _end_stream();
            _line_progressed(3);
        }
        else if(rem.begins_with('#'))
        {
            _c4dbgpf("it's a comment: '{}'", rem);
            _scan_comment();
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(" ") || rem.begins_with("\t"))
        {
            size_t n = rem.first_not_of(" \t");
            if(n == npos)
                n = rem.len;
            _c4dbgpf("has {} spaces/tabs, skip...", n);
            _line_progressed(n);
            return true;
        }
        else if(rem.empty())
        {
            // nothing to do
        }
        else if(rem == "---" || rem.begins_with("--- "))
        {
            _c4dbgp("caught ---: starting doc");
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with('%'))
        {
            _c4dbgp("caught a directive: ignoring...");
            _line_progressed(rem.len);
            return true;
        }
        else
        {
            _c4err("parse error");
        }

        if( ! saved_scalar.empty())
        {
            _store_scalar(saved_scalar, is_quoted);
        }

        return true;
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL));
        csubstr scalar;
        size_t indentation = m_state->line_contents.indentation; // save
        bool is_quoted;
        if(_scan_scalar_unk(&scalar, &is_quoted))
        {
            _c4dbgpf("got a {} scalar", is_quoted ? "quoted" : "");
            rem = m_state->line_contents.rem;
            {
                size_t first = rem.first_not_of(" \t");
                if(first && first != npos)
                {
                    _c4dbgpf("skip {} whitespace characters", first);
                   _line_progressed(first);
                   rem = rem.sub(first);
                }
            }
            _store_scalar(scalar, is_quoted);
            if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
            {
                _c4dbgpf("got a ': ' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(2); // call this AFTER saving the indentation
            }
            else if(rem == ":")
            {
                _c4dbgpf("got a ':' next -- it's a map (as_child={})", start_as_child);
                _push_level();
                _start_map(start_as_child); // wait for the val scalar to append the key-val pair
                _set_indentation(indentation);
                _line_progressed(1); // call this AFTER saving the indentation
            }
            else
            {
                // we still don't know whether it's a seq or a map
                // so just store the scalar
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            csubstr ws = rem.left_of(rem.first_not_of(" \t"));
            rem = rem.right_of(ws);
            if(has_all(RTOP) && rem.begins_with("---"))
            {
                _c4dbgp("there's a doc starting, and it's indented");
                _set_indentation(ws.len);
            }
            _c4dbgpf("skipping {} spaces/tabs", ws.len);
            _line_progressed(ws.len);
            return true;
        }
    }

    return false;
}